

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryManager.cpp
# Opt level: O0

void __thiscall Lodtalk::ClassTable::~ClassTable(ClassTable *this)

{
  bool bVar1;
  reference ppOVar2;
  Oop **page;
  iterator __end1;
  iterator __begin1;
  vector<Lodtalk::Oop_*,_std::allocator<Lodtalk::Oop_*>_> *__range1;
  ClassTable *this_local;
  
  __end1 = std::vector<Lodtalk::Oop_*,_std::allocator<Lodtalk::Oop_*>_>::begin(&this->pageTable);
  page = (Oop **)std::vector<Lodtalk::Oop_*,_std::allocator<Lodtalk::Oop_*>_>::end(&this->pageTable)
  ;
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Lodtalk::Oop_**,_std::vector<Lodtalk::Oop_*,_std::allocator<Lodtalk::Oop_*>_>_>
                                *)&page);
    if (!bVar1) break;
    ppOVar2 = __gnu_cxx::
              __normal_iterator<Lodtalk::Oop_**,_std::vector<Lodtalk::Oop_*,_std::allocator<Lodtalk::Oop_*>_>_>
              ::operator*(&__end1);
    if (*ppOVar2 != (Oop *)0x0) {
      operator_delete__(*ppOVar2);
    }
    __gnu_cxx::
    __normal_iterator<Lodtalk::Oop_**,_std::vector<Lodtalk::Oop_*,_std::allocator<Lodtalk::Oop_*>_>_>
    ::operator++(&__end1);
  }
  std::vector<Lodtalk::Oop_*,_std::allocator<Lodtalk::Oop_*>_>::~vector(&this->pageTable);
  SharedMutex::~SharedMutex(&this->sharedMutex);
  return;
}

Assistant:

ClassTable::~ClassTable()
{
    for(auto &page : pageTable)
        delete [] page;
}